

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O0

QNetworkReply * __thiscall
QNetworkAccessManagerPrivate::postProcess(QNetworkAccessManagerPrivate *this,QNetworkReply *reply)

{
  Object *sender;
  sockaddr *in_RSI;
  QNetworkAccessManagerPrivate *in_RDI;
  long in_FS_OFFSET;
  QNetworkAccessManager *q;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  QNetworkReply *in_stack_ffffffffffffff40;
  code *slot;
  ContextType *context;
  int __fd;
  QObject local_48 [8];
  offset_in_QNetworkReply_to_subr in_stack_ffffffffffffffc0;
  Connection local_28;
  ConnectionType type;
  Connection local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sender = (Object *)q_func(in_RDI);
  QNetworkReplyPrivate::setManager
            (in_stack_ffffffffffffff40,
             (QNetworkAccessManager *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
  ;
  slot = QNetworkReply::finished;
  context = (ContextType *)0x0;
  QObject::
  connect<void(QNetworkReply::*)(),QNetworkAccessManagerPrivate::postProcess(QNetworkReply*)::__0>
            (sender,in_stack_ffffffffffffffc0,(ContextType *)0x0,
             (anon_class_16_2_f86f53d7_for_o *)QNetworkReply::finished,(ConnectionType)in_RDI);
  type = (ConnectionType)in_RDI;
  QMetaObject::Connection::~Connection(&local_10);
  QObject::
  connect<void(QNetworkReply::*)(),QNetworkAccessManagerPrivate::postProcess(QNetworkReply*)::__1>
            (sender,in_stack_ffffffffffffffc0,context,(anon_class_16_2_f86f53d7_for_o *)slot,type);
  __fd = (int)sender;
  QMetaObject::Connection::~Connection(&local_28);
  QObject::connect((QObject *)&stack0xffffffffffffffc0,__fd,in_RSI,0x3c0bb4);
  QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffc0);
  QObject::connect(local_48,__fd,in_RSI,0x3c0bf6);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QNetworkReply *)in_RSI;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReply *QNetworkAccessManagerPrivate::postProcess(QNetworkReply *reply)
{
    Q_Q(QNetworkAccessManager);
    QNetworkReplyPrivate::setManager(reply, q);
    q->connect(reply, &QNetworkReply::finished, reply,
               [this, reply]() { _q_replyFinished(reply); });
#ifndef QT_NO_SSL
    /* In case we're compiled without SSL support, we don't have this signal and we need to
     * avoid getting a connection error. */
    q->connect(reply, &QNetworkReply::encrypted, reply,
               [this, reply]() { _q_replyEncrypted(reply); });
    q->connect(reply, SIGNAL(sslErrors(QList<QSslError>)), SLOT(_q_replySslErrors(QList<QSslError>)));
    q->connect(reply, SIGNAL(preSharedKeyAuthenticationRequired(QSslPreSharedKeyAuthenticator*)), SLOT(_q_replyPreSharedKeyAuthenticationRequired(QSslPreSharedKeyAuthenticator*)));
#endif

    return reply;
}